

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O1

void __thiscall
chrono::ChArchiveIn::in<chrono::ChFseqNode>
          (ChArchiveIn *this,
          ChNameValue<std::__cxx11::list<chrono::ChFseqNode,_std::allocator<chrono::ChFseqNode>_>_>
          *bVal)

{
  _List_node_base *this_00;
  list<chrono::ChFseqNode,std::allocator<chrono::ChFseqNode>> *plVar1;
  _Node *p_Var2;
  ulong uVar3;
  size_t arraysize;
  ChFunctorArchiveInSpecific<chrono::ChFseqNode> specFuncA;
  char idname [20];
  ChFseqNode element;
  ulong local_c8;
  undefined **local_c0;
  ChFseqNode *local_b8;
  char *local_b0;
  undefined ***local_a8;
  undefined1 local_a0;
  char local_98 [24];
  ChFseqNode local_80;
  
  this_00 = (_List_node_base *)bVal->_value;
  std::__cxx11::_List_base<chrono::ChFseqNode,_std::allocator<chrono::ChFseqNode>_>::_M_clear
            ((_List_base<chrono::ChFseqNode,_std::allocator<chrono::ChFseqNode>_> *)this_00);
  this_00->_M_prev = this_00;
  this_00->_M_next = this_00;
  this_00[1]._M_next = (_List_node_base *)0x0;
  (**(code **)(*(long *)this + 0x70))(this,bVal->_name,&local_c8);
  if (local_c8 != 0) {
    uVar3 = 0;
    do {
      sprintf(local_98,"%lu",uVar3);
      ChFseqNode::ChFseqNode(&local_80);
      local_c0 = &PTR__ChFunctorArchiveIn_00b6e1f0;
      local_a8 = &local_c0;
      local_a0 = 0;
      local_b8 = &local_80;
      local_b0 = local_98;
      (**(code **)(*(long *)this + 0x60))(this,&local_b0);
      plVar1 = (list<chrono::ChFseqNode,std::allocator<chrono::ChFseqNode>> *)bVal->_value;
      p_Var2 = std::__cxx11::list<chrono::ChFseqNode,std::allocator<chrono::ChFseqNode>>::
               _M_create_node<chrono::ChFseqNode_const&>(plVar1,&local_80);
      std::__detail::_List_node_base::_M_hook(&p_Var2->super__List_node_base);
      plVar1 = plVar1 + 0x10;
      *(long *)plVar1 = *(long *)plVar1 + 1;
      (**(code **)(*(long *)this + 0x78))(this,bVal->_name);
      if (local_80.fx.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount
          ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_80.fx.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 < local_c8);
  }
  (**(code **)(*(long *)this + 0x80))(this,bVal->_name);
  return;
}

Assistant:

void in     (ChNameValue< std::list<T> > bVal) {
          bVal.value().clear();
          size_t arraysize;
          this->in_array_pre(bVal.name(), arraysize);
          for (size_t i = 0; i<arraysize; ++i)
          {
              char idname[20];
              sprintf(idname, "%lu", (unsigned long)i);
              T element;
              ChNameValue< T > array_val(idname, element);
              this->in (array_val);
              bVal.value().push_back(element);
              this->in_array_between(bVal.name());
          }
          this->in_array_end(bVal.name());
      }